

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O1

void Abc_NtkCutsAddFanunt(Abc_Ntk_t *pNtk)

{
  int *piVar1;
  Abc_Obj_t *pNode;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pAVar4;
  uint uVar5;
  long lVar6;
  Abc_Obj_t *pFan0;
  Abc_Obj_t *pFan1;
  byte local_40;
  undefined7 uStack_3f;
  Abc_Obj_t *local_38;
  
  pVVar3 = pNtk->vObjs;
  if (pVVar3->nSize < 1) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar3->pArray[lVar6];
      if ((pNode != (Abc_Obj_t *)0x0) && (iVar2 = Abc_NodeIsMuxType(pNode), iVar2 != 0)) {
        pAVar4 = Abc_NodeRecognizeMux(pNode,&local_38,(Abc_Obj_t **)&local_40);
        local_40 = local_40 & 0xfe;
        piVar1 = (int *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x2c);
        *piVar1 = *piVar1 + 1;
        iVar2 = Abc_NodeIsExorType(pNode);
        if (iVar2 == 0) {
          uVar5 = uVar5 + 1;
        }
        else {
          piVar1 = (int *)(CONCAT71(uStack_3f,local_40) + 0x2c);
          *piVar1 = *piVar1 + 1;
          uVar5 = uVar5 + 2;
        }
      }
      lVar6 = lVar6 + 1;
      pVVar3 = pNtk->vObjs;
    } while (lVar6 < pVVar3->nSize);
  }
  printf("Added %d fanouts\n",(ulong)uVar5);
  return;
}

Assistant:

void Abc_NtkCutsAddFanunt( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFan0, * pFan1, * pFanC;
    int i, Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsMuxType(pObj) )
            continue;
        pFanC = Abc_NodeRecognizeMux( pObj, &pFan1, &pFan0 );
        pFanC = Abc_ObjRegular(pFanC);
        pFan0 = Abc_ObjRegular(pFan0);
        pFanC->vFanouts.nSize++;
        Counter++;
        if ( Abc_NodeIsExorType(pObj) )
        {
            pFan0->vFanouts.nSize++;
            Counter++;
        }
    }
    printf("Added %d fanouts\n", Counter );
}